

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ggwave.c
# Opt level: O0

int main(void)

{
  int iVar1;
  undefined4 uVar2;
  void *__ptr;
  ggwave_Instance instanceTmp_1;
  ggwave_Instance instanceTmp;
  int ne;
  char *waveform;
  int n;
  char decoded [16];
  char *payload;
  int ret;
  ggwave_Instance instance;
  ggwave_Parameters parameters;
  char local_48 [16];
  char *local_38;
  int local_30;
  undefined4 local_2c;
  undefined1 local_28 [8];
  undefined4 uStack_20;
  undefined4 local_18;
  undefined4 uStack_10;
  undefined4 uStack_c;
  undefined4 local_8;
  undefined4 local_4;
  
  local_4 = 0;
  ggwave_setLogFile(_stdout);
  ggwave_getDefaultParameters(local_28);
  uStack_10 = 4;
  uStack_c = 4;
  uVar2 = 4;
  local_2c = ggwave_init();
  local_38 = "test";
  iVar1 = ggwave_encode(local_2c,"test",4,2,0x32,0,1,uStack_20,local_18,uVar2,local_8);
  __ptr = malloc((long)iVar1);
  if (__ptr == (void *)0x0) {
    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.c"
            ,0x20,"waveform != NULL");
    exit(1);
  }
  iVar1 = ggwave_encode(local_2c,local_38,4,2,0x32,__ptr,0,uStack_20,local_18,uVar2,local_8);
  if (iVar1 < 1) {
    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.c"
            ,0x23,"ne > 0");
    exit(1);
  }
  local_30 = ggwave_ndecode(local_2c,__ptr,iVar1,local_48,3);
  if (local_30 != -2) {
    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.c"
            ,0x27,"ret == -2");
    exit(1);
  }
  local_30 = ggwave_ndecode(local_2c,__ptr,iVar1,local_48,4);
  if (local_30 != 4) {
    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.c"
            ,0x2b,"ret == 4");
    exit(1);
  }
  local_30 = ggwave_decode(local_2c,__ptr,iVar1,local_48);
  if (local_30 != 4) {
    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.c"
            ,0x2f,"ret == 4");
    exit(1);
  }
  ggwave_rxToggleProtocol(2,0);
  uVar2 = ggwave_init();
  local_30 = ggwave_ndecode(uVar2,__ptr,iVar1,local_48,4);
  if (local_30 != -1) {
    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.c"
            ,0x37,"ret == -1");
    exit(1);
  }
  ggwave_free(uVar2);
  ggwave_rxToggleProtocol(2,1);
  uVar2 = ggwave_init();
  local_30 = ggwave_ndecode(uVar2,__ptr,iVar1,local_48,4);
  if (local_30 != 4) {
    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.c"
            ,0x42,"ret == 4");
    exit(1);
  }
  ggwave_free(uVar2);
  local_48[local_30] = '\0';
  iVar1 = strcmp(local_48,local_38);
  if (iVar1 != 0) {
    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.c"
            ,0x48,"strcmp(decoded, payload) == 0");
    exit(1);
  }
  ggwave_free(local_2c);
  free(__ptr);
  return 0;
}

Assistant:

int main() {
    //ggwave_setLogFile(NULL); // disable logging
    ggwave_setLogFile(stdout);

    ggwave_Parameters parameters = ggwave_getDefaultParameters();
    parameters.sampleFormatInp = GGWAVE_SAMPLE_FORMAT_I16;
    parameters.sampleFormatOut = GGWAVE_SAMPLE_FORMAT_I16;

    ggwave_Instance instance = ggwave_init(parameters);

    int ret;
    const char * payload = "test";
    char decoded[16];

    int n = ggwave_encode(instance, payload, 4, GGWAVE_PROTOCOL_AUDIBLE_FASTEST, 50, NULL, 1);
    char *waveform = malloc(n);
    CHECK(waveform != NULL);

    int ne = ggwave_encode(instance, payload, 4, GGWAVE_PROTOCOL_AUDIBLE_FASTEST, 50, waveform, 0);
    CHECK(ne > 0);

    // not enough output buffer size to store the decoded message
    ret = ggwave_ndecode(instance, waveform, ne, decoded, 3);
    CHECK(ret == -2); // fail

    // just enough size to store it
    ret = ggwave_ndecode(instance, waveform, ne, decoded, 4);
    CHECK(ret == 4); // success

    // unsafe method - will write the decoded output to the output buffer regardless of the size
    ret = ggwave_decode(instance, waveform, ne, decoded);
    CHECK(ret == 4);

    // disable Rx protocol
    {
        ggwave_rxToggleProtocol(GGWAVE_PROTOCOL_AUDIBLE_FASTEST, 0);
        ggwave_Instance instanceTmp = ggwave_init(parameters);

        ret = ggwave_ndecode(instanceTmp, waveform, ne, decoded, 4);
        CHECK(ret == -1); // fail

        ggwave_free(instanceTmp);
    }

    // enable Rx protocol
    {
        ggwave_rxToggleProtocol(GGWAVE_PROTOCOL_AUDIBLE_FASTEST, 1);
        ggwave_Instance instanceTmp = ggwave_init(parameters);

        ret = ggwave_ndecode(instanceTmp, waveform, ne, decoded, 4);
        CHECK(ret == 4); // success

        ggwave_free(instanceTmp);
    }

    decoded[ret] = 0; // null-terminate the received data
    CHECK(strcmp(decoded, payload) == 0);

    ggwave_free(instance);
    free(waveform);

    return 0;
}